

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O1

void __thiscall FIX50::Message::Message(Message *this,MsgType *msgtype)

{
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  undefined1 local_90 [16];
  _Alloc_hider local_80;
  char local_70 [16];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  size_t local_40;
  int local_38;
  
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"FIXT.1.1","");
  local_90._0_8_ = &PTR__FieldBase_00325880;
  local_90._8_4_ = 8;
  local_80._M_p = local_70;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_b0,local_a8 + (long)local_b0);
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = 0;
  local_38 = 0;
  local_90._0_8_ = &PTR__FieldBase_00326268;
  local_60._M_p = (pointer)&local_50;
  FIX::Message::Message(&this->super_Message,(BeginString *)local_90,msgtype);
  FIX::FieldBase::~FieldBase((FieldBase *)local_90);
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  *(undefined ***)this = &PTR__Message_00327ed0;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"7","");
  local_90._0_8_ = &PTR__FieldBase_00325880;
  local_90._8_4_ = 0x468;
  local_80._M_p = local_70;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_b0,local_a8 + (long)local_b0);
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = 0;
  local_38 = 0;
  local_90._0_8_ = &PTR__FieldBase_00325800;
  local_60._M_p = (pointer)&local_50;
  FIX::FieldMap::setField((FieldMap *)&this->field_0x70,(FieldBase *)local_90,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_90);
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  return;
}

Assistant:

Message( const FIX::MsgType& msgtype )
    : FIX::Message(
      FIX::BeginString("FIXT.1.1"), msgtype )
     { getHeader().setField( FIX::ApplVerID("7") ); }